

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTerminalAttribute<std::array<float,_2UL>_>::TypedTerminalAttribute
          (TypedTerminalAttribute<std::array<float,_2UL>_> *this)

{
  TypedTerminalAttribute<std::array<float,_2UL>_> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas);
  this->_authored = false;
  ::std::__cxx11::string::string((string *)&this->_actual_type_name);
  return;
}

Assistant:

void set_authored(bool onoff) { _authored = onoff; }